

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O1

void place_object(chunk_conflict *c,loc_conflict grid,wchar_t level,_Bool good,_Bool great,
                 uint8_t origin,wchar_t tval)

{
  _Bool _Var1;
  uint8_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  int32_t rating;
  object *new_obj;
  _Bool local_3d;
  int32_t local_3c;
  object *local_38;
  
  local_3c = 0;
  local_3d = true;
  _Var1 = square_in_bounds(c,(loc)grid);
  if (_Var1) {
    _Var1 = square_canputitem(c,(loc)grid);
    if (_Var1) {
      local_38 = make_object((chunk *)c,level,good,great,false,&local_3c,tval);
      if (local_38 != (object *)0x0) {
        local_38->origin = origin;
        uVar2 = convert_depth_to_origin(c->depth);
        local_38->origin_depth = uVar2;
        local_38->origin_place = player->place;
        _Var1 = floor_carry((chunk *)c,(loc)grid,local_38,&local_3d);
        if (_Var1) {
          list_object(c,local_38);
          if (local_38->artifact != (artifact *)0x0) {
            c->good_item = true;
          }
          if (local_3c < 0x2625a1) {
            if (local_3c < -2500000) {
              local_3c = -2500000;
            }
          }
          else {
            local_3c = 2500000;
          }
          uVar3 = (local_3c / 100) * (local_3c / 100);
          uVar4 = 0xffffffff;
          if (!CARRY4(uVar3,c->obj_rating)) {
            uVar4 = uVar3 + c->obj_rating;
          }
          c->obj_rating = uVar4;
        }
        else {
          if (local_38->artifact != (artifact *)0x0) {
            mark_artifact_created(local_38->artifact,false);
          }
          object_delete((chunk *)c,(chunk *)0x0,&local_38);
        }
      }
    }
  }
  return;
}

Assistant:

void place_object(struct chunk *c, struct loc grid, int level, bool good,
		bool great, uint8_t origin, int tval)
{
	int32_t rating = 0;
	struct object *new_obj;
	bool dummy = true;

	if (!square_in_bounds(c, grid)) return;
	if (!square_canputitem(c, grid)) return;

	/* Make an appropriate object */
	new_obj = make_object(c, level, good, great, false, &rating, tval);
	if (!new_obj) return;
	new_obj->origin = origin;
	new_obj->origin_depth = convert_depth_to_origin(c->depth);
	new_obj->origin_place = player->place;

	/* Give it to the floor */
	if (!floor_carry(c, grid, new_obj, &dummy)) {
		if (new_obj->artifact) {
			mark_artifact_created(new_obj->artifact, false);
		}
		object_delete(c, NULL, &new_obj);
		return;
	} else {
		uint32_t sqrating;

		list_object(c, new_obj);
		if (new_obj->artifact) {
			c->good_item = true;
		}
		/* Avoid overflows */
		if (rating > 2500000) {
			rating = 2500000;
		} else if (rating < -2500000) {
			rating = -2500000;
		}
		sqrating = (rating / 100) * (rating / 100);
		if (c->obj_rating < UINT32_MAX - sqrating) {
			c->obj_rating += sqrating;
		} else {
			c->obj_rating = UINT32_MAX;
		}
	}
}